

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

MicroRep * __thiscall google::protobuf::internal::MicroString::micro_rep(MicroString *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  LogMessage local_28;
  Voidify local_11;
  MicroString *local_10;
  MicroString *this_local;
  
  local_10 = this;
  bVar1 = is_micro_rep(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (MicroRep *)((long)this->rep_ + -2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x148,"is_micro_rep()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

MicroRep* micro_rep() const {
    ABSL_DCHECK(is_micro_rep());
    // NOTE: We use `-` instead of `&` so that the arithmetic gets folded into
    // offsets after the cast.
    // ie `micro_rep()->data()` cancel each other out.
    return reinterpret_cast<MicroRep*>(reinterpret_cast<uintptr_t>(rep_) -
                                       kIsMicroRepTag);
  }